

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize_t __thiscall JetHead::Socket::write(Socket *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  sVar1 = send(this->mFd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0x4000);
  return sVar1;
}

Assistant:

int Socket::write( const void *buffer, int len )
{
	// Passing in the MSG_NOSIGNAL flag to tell the OS not to send us
	// SIGPIPE when the socket is closed during this call.  At some
	// point we might make this a member variable that can be tweaked
	// by the user, but that's interface clutter that we don't need
	// yet.
	return ::send(mFd, buffer, len, MSG_NOSIGNAL);
}